

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void htmlstartElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  size_t sVar1;
  int local_68;
  int local_64;
  int attlen;
  int outlen;
  uchar *att;
  uchar output [40];
  int local_24;
  int i;
  xmlChar **atts_local;
  xmlChar *name_local;
  void *ctx_local;
  
  fprintf((FILE *)SAXdebug,"SAX.startElement(%s",name);
  if (atts != (xmlChar **)0x0) {
    for (local_24 = 0; atts[local_24] != (xmlChar *)0x0; local_24 = local_24 + 2) {
      fprintf((FILE *)SAXdebug,", %s",atts[local_24]);
      if (atts[local_24 + 1] != (xmlChar *)0x0) {
        _attlen = atts[local_24 + 1];
        fprintf((FILE *)SAXdebug,"=\'");
        while( true ) {
          sVar1 = strlen((char *)_attlen);
          local_68 = (int)sVar1;
          if (local_68 < 1) break;
          local_64 = 0x27;
          htmlEncodeEntities(&att,&local_64,_attlen,&local_68,0x27);
          output[(long)local_64 + -8] = '\0';
          fprintf((FILE *)SAXdebug,"%s",&att);
          _attlen = _attlen + local_68;
        }
        fprintf((FILE *)SAXdebug,"\'");
      }
    }
  }
  fprintf((FILE *)SAXdebug,")\n");
  return;
}

Assistant:

static void
htmlstartElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    fprintf(SAXdebug, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(SAXdebug, ", %s", atts[i++]);
	    if (atts[i] != NULL) {
		unsigned char output[40];
		const unsigned char *att = atts[i];
		int outlen, attlen;
	        fprintf(SAXdebug, "='");
		while ((attlen = strlen((char*)att)) > 0) {
		    outlen = sizeof output - 1;
		    htmlEncodeEntities(output, &outlen, att, &attlen, '\'');
		    output[outlen] = 0;
		    fprintf(SAXdebug, "%s", (char *) output);
		    att += attlen;
		}
		fprintf(SAXdebug, "'");
	    }
	}
    }
    fprintf(SAXdebug, ")\n");
}